

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_cast.cpp
# Opt level: O2

bool duckdb::StringEnumCast<unsigned_int>
               (Vector *source,Vector *result,idx_t count,CastParameters *parameters)

{
  string_t *source_data;
  uint *result_data;
  bool bVar1;
  VectorTryCastData vector_cast_data;
  ValidityMask source_mask;
  VectorTryCastData vector_cast_data_1;
  
  if (source->vector_type == CONSTANT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    source_data = (string_t *)source->data;
    TemplatedValidityMask<unsigned_long>::TemplatedValidityMask
              (&source_mask.super_TemplatedValidityMask<unsigned_long>,
               &(source->validity).super_TemplatedValidityMask<unsigned_long>);
    vector_cast_data.all_converted = true;
    vector_cast_data.result = result;
    vector_cast_data.parameters = parameters;
    bVar1 = StringEnumCastLoop<unsigned_int>
                      (source_data,
                       (ValidityMask *)&source_mask.super_TemplatedValidityMask<unsigned_long>,
                       &source->type,(uint *)result->data,&result->validity,&result->type,1,
                       &vector_cast_data,(SelectionVector *)0x0);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&source_mask.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&source_mask);
    Vector::ToUnifiedFormat(source,count,(UnifiedVectorFormat *)&source_mask);
    Vector::SetVectorType(result,FLAT_VECTOR);
    TemplatedValidityMask<unsigned_long>::TemplatedValidityMask
              ((TemplatedValidityMask<unsigned_long> *)&vector_cast_data,
               (TemplatedValidityMask<unsigned_long> *)
               &source_mask.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    result_data = (uint *)result->data;
    FlatVector::VerifyFlatVector(result);
    vector_cast_data_1.all_converted = true;
    vector_cast_data_1.result = result;
    vector_cast_data_1.parameters = parameters;
    bVar1 = StringEnumCastLoop<unsigned_int>
                      ((string_t *)
                       source_mask.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                       .
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,(ValidityMask *)&vector_cast_data,&source->type,result_data,
                       &result->validity,&result->type,count,&vector_cast_data_1,
                       (SelectionVector *)
                       source_mask.super_TemplatedValidityMask<unsigned_long>.validity_mask);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&vector_cast_data.all_converted);
    UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&source_mask);
  }
  return bVar1;
}

Assistant:

bool StringEnumCast(Vector &source, Vector &result, idx_t count, CastParameters &parameters) {
	D_ASSERT(source.GetType().id() == LogicalTypeId::VARCHAR);
	switch (source.GetVectorType()) {
	case VectorType::CONSTANT_VECTOR: {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);

		auto source_data = ConstantVector::GetData<string_t>(source);
		auto source_mask = ConstantVector::Validity(source);
		auto result_data = ConstantVector::GetData<T>(result);
		auto &result_mask = ConstantVector::Validity(result);

		VectorTryCastData vector_cast_data(result, parameters);
		return StringEnumCastLoop(source_data, source_mask, source.GetType(), result_data, result_mask,
		                          result.GetType(), 1, vector_cast_data, nullptr);
	}
	default: {
		UnifiedVectorFormat vdata;
		source.ToUnifiedFormat(count, vdata);

		result.SetVectorType(VectorType::FLAT_VECTOR);

		auto source_data = UnifiedVectorFormat::GetData<string_t>(vdata);
		auto source_sel = vdata.sel;
		auto source_mask = vdata.validity;
		auto result_data = FlatVector::GetData<T>(result);
		auto &result_mask = FlatVector::Validity(result);

		VectorTryCastData vector_cast_data(result, parameters);
		return StringEnumCastLoop(source_data, source_mask, source.GetType(), result_data, result_mask,
		                          result.GetType(), count, vector_cast_data, source_sel);
	}
	}
}